

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
* wasm::WATParser::makeResumeTable<wasm::WATParser::ParseDefsCtx>
            (Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
             *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  OnClauseInfo info;
  OnClauseInfo info_00;
  Name tag_00;
  pointer pOVar1;
  bool bVar2;
  Name *pNVar3;
  uint *puVar4;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_1e9;
  string local_1e8;
  Err local_1c8;
  size_t local_1a8;
  char *pcStack_1a0;
  OnClauseInfo local_198;
  Err local_180;
  Err *local_160;
  Err *err_1;
  Result<unsigned_int> _val_1;
  Result<unsigned_int> label;
  OnClauseInfo local_f8;
  string_view local_e0;
  uint local_cc;
  Err local_c8;
  Err *local_a8;
  Err *err;
  Result<wasm::Name> _val;
  Result<wasm::Name> tag;
  undefined1 local_30 [8];
  OnClauseListT resumetable;
  ParseDefsCtx *ctx_local;
  
  resumetable.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ctx;
  ParseDefsCtx::makeOnClauseList((OnClauseListT *)local_30,ctx);
  do {
    pNVar3 = &(resumetable.
               super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->tag;
    expected = sv("on",2);
    bVar2 = Lexer::takeSExprStart((Lexer *)&(pNVar3->super_IString).str._M_str,expected);
    if (!bVar2) {
      Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>>>
      ::
      Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>>>
                ((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>>>
                  *)__return_storage_ptr__,
                 (vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                  *)local_30);
      local_cc = 1;
      break;
    }
    tagidx<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
               (ParseDefsCtx *)
               resumetable.
               super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Result<wasm::Name>::Result
              ((Result<wasm::Name> *)&err,
               (Result<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    local_a8 = Result<wasm::Name>::getErr((Result<wasm::Name> *)&err);
    bVar2 = local_a8 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_c8,local_a8);
      Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
      ::Result(__return_storage_ptr__,&local_c8);
      wasm::Err::~Err(&local_c8);
    }
    local_cc = (uint)bVar2;
    Result<wasm::Name>::~Result((Result<wasm::Name> *)&err);
    if (local_cc == 0) {
      pNVar3 = &(resumetable.
                 super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->tag;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"switch");
      bVar2 = Lexer::takeKeyword((Lexer *)&(pNVar3->super_IString).str._M_str,local_e0);
      pOVar1 = resumetable.
               super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        pNVar3 = Result<wasm::Name>::operator*
                           ((Result<wasm::Name> *)
                            ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        ParseDefsCtx::makeOnSwitch
                  (&local_f8,(ParseDefsCtx *)pOVar1,(Name)(pNVar3->super_IString).str);
        info.tag.super_IString.str._M_str = local_f8.tag.super_IString.str._M_str;
        info.tag.super_IString.str._M_len = local_f8.tag.super_IString.str._M_len;
        info.label = local_f8.label;
        info.isOnSwitch = local_f8.isOnSwitch;
        info._21_3_ = local_f8._21_3_;
        ParseDefsCtx::appendOnClause
                  ((ParseDefsCtx *)pOVar1,
                   (vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    *)local_30,info);
      }
      else {
        labelidx<wasm::WATParser::ParseDefsCtx>
                  ((Result<unsigned_int> *)
                   ((long)&_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                   (ParseDefsCtx *)
                   resumetable.
                   super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
        Result<unsigned_int>::Result
                  ((Result<unsigned_int> *)&err_1,
                   (Result<unsigned_int> *)
                   ((long)&_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        local_160 = Result<unsigned_int>::getErr((Result<unsigned_int> *)&err_1);
        bVar2 = local_160 != (Err *)0x0;
        if (bVar2) {
          wasm::Err::Err(&local_180,local_160);
          Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
          ::Result(__return_storage_ptr__,&local_180);
          wasm::Err::~Err(&local_180);
        }
        local_cc = (uint)bVar2;
        Result<unsigned_int>::~Result((Result<unsigned_int> *)&err_1);
        pOVar1 = resumetable.
                 super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_cc == 0) {
          pNVar3 = Result<wasm::Name>::operator*
                             ((Result<wasm::Name> *)
                              ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
          local_1a8 = (pNVar3->super_IString).str._M_len;
          pcStack_1a0 = (pNVar3->super_IString).str._M_str;
          puVar4 = Result<unsigned_int>::operator*
                             ((Result<unsigned_int> *)
                              ((long)&_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                      super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                      super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
          tag_00.super_IString.str._M_str = pcStack_1a0;
          tag_00.super_IString.str._M_len = local_1a8;
          ParseDefsCtx::makeOnLabel(&local_198,(ParseDefsCtx *)pOVar1,tag_00,*puVar4);
          info_00.tag.super_IString.str._M_str = local_198.tag.super_IString.str._M_str;
          info_00.tag.super_IString.str._M_len = local_198.tag.super_IString.str._M_len;
          info_00.label = local_198.label;
          info_00.isOnSwitch = local_198.isOnSwitch;
          info_00._21_3_ = local_198._21_3_;
          ParseDefsCtx::appendOnClause
                    ((ParseDefsCtx *)pOVar1,
                     (vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                      *)local_30,info_00);
          local_cc = 0;
        }
        Result<unsigned_int>::~Result
                  ((Result<unsigned_int> *)
                   ((long)&_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        if (local_cc != 0) goto LAB_024f750e;
      }
      bVar2 = Lexer::takeRParen((Lexer *)&((resumetable.
                                            super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->tag
                                          ).super_IString.str._M_str);
      if (bVar2) {
        local_cc = 0;
      }
      else {
        pNVar3 = &(resumetable.
                   super__Vector_base<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->tag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"expected \')\' at end of handler clause",&local_1e9);
        Lexer::err(&local_1c8,(Lexer *)&(pNVar3->super_IString).str._M_str,&local_1e8);
        Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
        ::Result(__return_storage_ptr__,&local_1c8);
        wasm::Err::~Err(&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        local_cc = 1;
      }
    }
LAB_024f750e:
    Result<wasm::Name>::~Result
              ((Result<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  } while (local_cc == 0);
  std::
  vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
  ::~vector((vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::OnClauseListT> makeResumeTable(Ctx& ctx) {
  auto resumetable = ctx.makeOnClauseList();
  while (ctx.in.takeSExprStart("on"sv)) {
    auto tag = tagidx(ctx);
    CHECK_ERR(tag);
    if (ctx.in.takeKeyword("switch")) {
      ctx.appendOnClause(resumetable, ctx.makeOnSwitch(*tag));
    } else {
      auto label = labelidx(ctx);
      CHECK_ERR(label);
      ctx.appendOnClause(resumetable, ctx.makeOnLabel(*tag, *label));
    }
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of handler clause");
    }
  }
  return resumetable;
}